

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  CameraSample sample_03;
  CameraSample sample_04;
  CameraSample sample_05;
  CameraSample sample_06;
  CameraSample sample_07;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  SampledWavelengths *lambda_00;
  PerspectiveCamera *pPVar17;
  byte bVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte local_158;
  float local_150 [4];
  optional<pbrt::CameraRayDifferential> *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  anon_struct_8_0_00000001_for___align local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined8 local_100;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_f8;
  char local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_88;
  char local_50;
  undefined1 local_48 [16];
  
  uVar3 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  lambda_00 = (SampledWavelengths *)CONCAT71((int7)((ulong)lambda >> 8),0x30);
  pPVar17 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
  if ((ushort)(uVar3 >> 0x30) < 3) {
    if ((uVar3 & 0x3000000000000) == 0x2000000000000) {
      OrthographicCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_88.__align,(OrthographicCamera *)pPVar17,sample
                 ,lambda_00);
    }
    else {
      PerspectiveCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_88.__align,pPVar17,sample,lambda_00);
    }
  }
  else if ((uVar3 & 0xfffe000000000000) == 0x2000000000000) {
    SphericalCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_88.__align,(SphericalCamera *)pPVar17,sample,
               lambda_00);
  }
  else {
    RealisticCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_88.__align,(RealisticCamera *)pPVar17,sample,
               lambda_00);
  }
  local_140 = __return_storage_ptr__;
  if (local_50 == '\0') {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    lVar19 = 0;
    local_150[3] = (float)local_88._24_4_;
    local_138 = local_88._16_8_;
    uStack_130 = 0;
    local_128 = local_88.__align;
    uStack_120 = local_88._8_8_;
    local_150[0] = 0.05;
    local_150[1] = -0.05;
    local_100 = local_88._32_8_;
    do {
      local_118 = ZEXT416((uint)*(float *)((long)local_150 + lVar19));
      fVar4 = *(float *)((long)local_150 + lVar19) +
              sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
      uVar3 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar17 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
      uVar1 = sample._16_8_;
      if (uVar3 < 0x3000000000000) {
        if ((uVar3 & 0x3000000000000) == 0x2000000000000) {
          auVar8._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
          auVar8._0_8_ = CONCAT44(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y,fVar4);
          auVar8._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar8._8_8_;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.y =
               (float)(int)((ulong)auVar8._8_8_ >> 0x20);
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
          sample_00.time = (Float)(int)uVar1;
          sample_00.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_f8.__align,(OrthographicCamera *)pPVar17,
                     sample_00,(SampledWavelengths *)0x2000000000000);
        }
        else {
          auVar7._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
          auVar7._0_8_ = CONCAT44(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y,fVar4);
          auVar7._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar7._8_8_;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.y =
               (float)(int)((ulong)auVar7._8_8_ >> 0x20);
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
          sample_02.time = (Float)(int)uVar1;
          sample_02.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_f8.__align,pPVar17,sample_02,
                     (SampledWavelengths *)0x2000000000000);
        }
      }
      else if ((uVar3 & 0xfffe000000000000) == 0x2000000000000) {
        auVar6._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
        auVar6._0_8_ = CONCAT44(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y,fVar4);
        auVar6._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar6._8_8_;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.y =
             (float)(int)((ulong)auVar6._8_8_ >> 0x20);
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
        sample_01.time = (Float)(int)uVar1;
        sample_01.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_f8.__align,(SphericalCamera *)pPVar17,
                   sample_01,(SampledWavelengths *)0x2000000000000);
      }
      else {
        auVar5._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
        auVar5._0_8_ = CONCAT44(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y,fVar4);
        auVar5._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar5._8_8_;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.y =
             (float)(int)((ulong)auVar5._8_8_ >> 0x20);
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
        sample_03.time = (Float)(int)uVar1;
        sample_03.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_f8.__align,(RealisticCamera *)pPVar17,
                   sample_03,(SampledWavelengths *)0x2000000000000);
      }
      if (local_c0 == '\x01') {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_f8.__align;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_f8._12_8_;
        auVar5 = vinsertps_avx(local_f8._20_16_,ZEXT416((uint)local_f8._8_4_),0x10);
        auVar22._8_8_ = uStack_120;
        auVar22._0_8_ = local_128;
        auVar21._8_8_ = uStack_130;
        auVar21._0_8_ = local_138;
        auVar30._4_4_ = local_118._0_4_;
        auVar30._0_4_ = local_118._0_4_;
        auVar30._8_4_ = local_118._0_4_;
        auVar30._12_4_ = local_118._0_4_;
        local_158 = 1;
        auVar20 = vpermi2ps_avx512vl(_DAT_00562b40,auVar21,auVar22);
        auVar21 = vpermi2ps_avx512vl(_DAT_00562b30,auVar22,auVar21);
        auVar6 = vsubps_avx(auVar28,auVar22);
        auVar7 = vsubps_avx(auVar23,auVar20);
        auVar8 = vsubps_avx(auVar5,auVar21);
        auVar5 = vdivps_avx(auVar6,auVar30);
        auVar6 = vdivps_avx(auVar7,auVar30);
        auVar7 = vdivps_avx(auVar8,auVar30);
        local_98 = local_128._0_4_ + auVar5._0_4_;
        fStack_94 = local_128._4_4_ + auVar5._4_4_;
        fStack_90 = (float)uStack_120 + auVar5._8_4_;
        fStack_8c = (float)((ulong)uStack_120 >> 0x20) + auVar5._12_4_;
        local_a8 = auVar20._0_4_ + auVar6._0_4_;
        fStack_a4 = auVar20._4_4_ + auVar6._4_4_;
        fStack_a0 = auVar20._8_4_ + auVar6._8_4_;
        fStack_9c = auVar20._12_4_ + auVar6._12_4_;
        local_b8 = auVar21._0_4_ + auVar7._0_4_;
        fStack_b4 = auVar21._4_4_ + auVar7._4_4_;
        fStack_b0 = auVar21._8_4_ + auVar7._8_4_;
        fStack_ac = auVar21._12_4_ + auVar7._12_4_;
        goto LAB_00322651;
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 8);
    local_b8 = 0.0;
    fStack_b4 = 0.0;
    fStack_b0 = 0.0;
    fStack_ac = 0.0;
    local_158 = 0;
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
    local_a8 = 0.0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
LAB_00322651:
    lVar19 = 0;
    local_150[0] = 0.05;
    local_150[1] = -0.05;
    local_118._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
    do {
      fVar4 = *(float *)((long)local_150 + lVar19) + (float)local_118._0_4_;
      local_48 = ZEXT416((uint)*(float *)((long)local_150 + lVar19));
      uVar3 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar17 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
      if (uVar3 < 0x3000000000000) {
        if ((uVar3 & 0x3000000000000) == 0x2000000000000) {
          auVar9._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
          auVar9._0_8_ = CONCAT44(fVar4,sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x);
          auVar9._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar9._8_8_;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float>.y =
               (float)(int)((ulong)auVar9._8_8_ >> 0x20);
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
          sample_04.time = (Float)(int)uVar1;
          sample_04.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_f8.__align,(OrthographicCamera *)pPVar17,
                     sample_04,(SampledWavelengths *)0x2000000000000);
        }
        else {
          auVar11._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
          auVar11._0_8_ = CONCAT44(fVar4,sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x);
          auVar11._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar11._8_8_;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float>.y =
               (float)(int)((ulong)auVar11._8_8_ >> 0x20);
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
          sample_06.time = (Float)(int)uVar1;
          sample_06.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_f8.__align,pPVar17,sample_06,
                     (SampledWavelengths *)0x2000000000000);
        }
      }
      else if ((uVar3 & 0xfffe000000000000) == 0x2000000000000) {
        auVar10._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
        auVar10._0_8_ = CONCAT44(fVar4,sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x);
        auVar10._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar10._8_8_;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float>.y =
             (float)(int)((ulong)auVar10._8_8_ >> 0x20);
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
        sample_05.time = (Float)(int)uVar1;
        sample_05.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_f8.__align,(SphericalCamera *)pPVar17,
                   sample_05,(SampledWavelengths *)0x2000000000000);
      }
      else {
        auVar20._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
        auVar20._0_8_ = CONCAT44(fVar4,sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x);
        auVar20._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar20._8_8_;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float>.y =
             (float)(int)((ulong)auVar20._8_8_ >> 0x20);
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
        sample_07.time = (Float)(int)uVar1;
        sample_07.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_f8.__align,(RealisticCamera *)pPVar17,
                   sample_07,(SampledWavelengths *)0x2000000000000);
      }
      bVar18 = 0;
      if (local_c0 == '\x01') {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_f8.__align;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_f8._12_8_;
        auVar5 = vinsertps_avx(local_f8._20_16_,ZEXT416((uint)local_f8._8_4_),0x10);
        bVar18 = 1;
        auVar13._8_8_ = uStack_120;
        auVar13._0_8_ = local_128;
        auVar12._8_8_ = uStack_130;
        auVar12._0_8_ = local_138;
        auVar31._4_4_ = local_48._0_4_;
        auVar31._0_4_ = local_48._0_4_;
        auVar31._8_4_ = local_48._0_4_;
        auVar31._12_4_ = local_48._0_4_;
        auVar21 = vpermi2ps_avx512vl(_DAT_00562b30,auVar13,auVar12);
        auVar22 = vpermi2ps_avx512vl(_DAT_00562b40,auVar12,auVar13);
        auVar6 = vsubps_avx(auVar25,auVar13);
        auVar7 = vsubps_avx(auVar5,auVar21);
        auVar8 = vsubps_avx(auVar27,auVar22);
        auVar5 = vdivps_avx(auVar6,auVar31);
        auVar6 = vdivps_avx(auVar7,auVar31);
        auVar7 = vdivps_avx(auVar8,auVar31);
        auVar24._0_4_ = local_128._0_4_ + auVar5._0_4_;
        auVar24._4_4_ = local_128._4_4_ + auVar5._4_4_;
        auVar24._8_4_ = (float)uStack_120 + auVar5._8_4_;
        auVar24._12_4_ = (float)((ulong)uStack_120 >> 0x20) + auVar5._12_4_;
        auVar26._0_4_ = auVar22._0_4_ + auVar7._0_4_;
        auVar26._4_4_ = auVar22._4_4_ + auVar7._4_4_;
        auVar26._8_4_ = auVar22._8_4_ + auVar7._8_4_;
        auVar26._12_4_ = auVar22._12_4_ + auVar7._12_4_;
        auVar29._0_4_ = auVar21._0_4_ + auVar6._0_4_;
        auVar29._4_4_ = auVar21._4_4_ + auVar6._4_4_;
        auVar29._8_4_ = auVar21._8_4_ + auVar6._8_4_;
        auVar29._12_4_ = auVar21._12_4_ + auVar6._12_4_;
        goto LAB_0032285a;
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 8);
    auVar24 = ZEXT816(0) << 0x40;
    auVar26 = ZEXT816(0) << 0x40;
    auVar29 = ZEXT816(0) << 0x40;
LAB_0032285a:
    auVar33._8_8_ = uStack_130;
    auVar33._0_8_ = local_138;
    auVar32._8_8_ = uStack_120;
    auVar32._0_8_ = local_128;
    auVar16._4_4_ = fStack_94;
    auVar16._0_4_ = local_98;
    auVar16._8_4_ = fStack_90;
    auVar16._12_4_ = fStack_8c;
    local_140->set = true;
    *(undefined1 (*) [16])&local_140->optionalValue = auVar32;
    uVar1 = vmovlps_avx(auVar33);
    *(undefined8 *)((long)&local_140->optionalValue + 0x10) = uVar1;
    auVar15._4_4_ = fStack_a4;
    auVar15._0_4_ = local_a8;
    auVar15._8_4_ = fStack_a0;
    auVar15._12_4_ = fStack_9c;
    *(float *)((long)&local_140->optionalValue + 0x18) = local_150[3];
    *(undefined8 *)((long)&local_140->optionalValue + 0x20) = local_100;
    (local_140->optionalValue).__data[0x28] = local_158 & bVar18;
    uVar1 = vmovlps_avx(auVar16);
    *(undefined8 *)((long)&local_140->optionalValue + 0x2c) = uVar1;
    auVar14._4_4_ = fStack_b4;
    auVar14._0_4_ = local_b8;
    auVar14._8_4_ = fStack_b0;
    auVar14._12_4_ = fStack_ac;
    uVar2 = vextractps_avx(auVar14,1);
    *(undefined4 *)((long)&local_140->optionalValue + 0x34) = uVar2;
    uVar1 = vmovlps_avx(auVar24);
    *(undefined8 *)((long)&local_140->optionalValue + 0x38) = uVar1;
    uVar2 = vextractps_avx(auVar29,1);
    *(undefined4 *)((long)&local_140->optionalValue + 0x40) = uVar2;
    uVar1 = vmovlps_avx(auVar15);
    *(undefined8 *)((long)&local_140->optionalValue + 0x44) = uVar1;
    *(float *)((long)&local_140->optionalValue + 0x4c) = local_b8;
    uVar1 = vmovlps_avx(auVar26);
    *(undefined8 *)((long)&local_140->optionalValue + 0x50) = uVar1;
    *(int *)((long)&local_140->optionalValue + 0x58) = auVar29._0_4_;
    *(undefined8 *)((long)&local_140->optionalValue + 0x60) = local_88._40_8_;
    *(undefined8 *)((long)&local_140->optionalValue + 0x68) = local_88._48_8_;
  }
  return local_140;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, CameraSample sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}